

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isVirtualInterfaceOrArray(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  
  while( true ) {
    pTVar2 = getCanonicalType(this);
    SVar1 = (pTVar2->super_Symbol).kind;
    if ((QueueType < SVar1) || ((0x26000U >> (SVar1 & UntypedType) & 1) == 0)) break;
    this = getArrayElementType(pTVar2);
  }
  pTVar2 = getCanonicalType(pTVar2);
  return (pTVar2->super_Symbol).kind == VirtualInterfaceType;
}

Assistant:

bool Type::isVirtualInterfaceOrArray() const {
    auto ct = &getCanonicalType();
    while (true) {
        switch (ct->kind) {
            case SymbolKind::FixedSizeUnpackedArrayType:
            case SymbolKind::DynamicArrayType:
            case SymbolKind::QueueType:
                ct = &ct->getArrayElementType()->getCanonicalType();
                break;
            default:
                return ct->isVirtualInterface();
        }
    }
}